

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O1

int prs_branch(Node **top,PToken *tok,int term,OnigUChar **src,OnigUChar *end,ParseEnv *env,
              int group_head)

{
  _Node *p_Var1;
  Node *pNVar2;
  uint uVar3;
  int iVar4;
  Node *pNVar5;
  Node *pNVar6;
  Node *local_50;
  OnigUChar **local_48;
  _Node *local_40;
  OnigUChar *local_38;
  
  *top = (Node *)0x0;
  uVar3 = env->parse_depth + 1;
  env->parse_depth = uVar3;
  if (ParseDepthLimit < uVar3) {
    return -0x10;
  }
  local_48 = src;
  iVar4 = prs_exp(&local_50,tok,term,src,end,env,group_head);
  if (iVar4 < 0) {
LAB_00113b41:
    pNVar5 = local_50;
    if (local_50 != (Node *)0x0) {
      node_free_body(local_50);
      free(pNVar5);
    }
  }
  else {
    if ((iVar4 == 0) || (iVar4 == term || iVar4 == 0xd)) {
      *top = local_50;
    }
    else {
      local_40 = local_50;
      local_38 = end;
      pNVar5 = (Node *)malloc(0x48);
      if (pNVar5 == (Node *)0x0) {
        pNVar5 = (Node *)0x0;
      }
      else {
        (pNVar5->u).quant.next_head_exact = (_Node *)0x0;
        (pNVar5->u).cclass.mbuf = (BBuf *)0x0;
        (pNVar5->u).call.name = (OnigUChar *)0x0;
        (pNVar5->u).quant.head_exact = (_Node *)0x0;
        (pNVar5->u).base.body = (_Node *)0x0;
        (pNVar5->u).str.end = (OnigUChar *)0x0;
        *(undefined8 *)&pNVar5->u = 0;
        (pNVar5->u).base.parent = (_Node *)0x0;
        *(undefined8 *)((long)&pNVar5->u + 0x40) = 0;
      }
      if (pNVar5 == (Node *)0x0) {
        pNVar5 = (Node *)0x0;
      }
      else {
        (pNVar5->u).base.node_type = ND_LIST;
        (pNVar5->u).base.body = local_40;
        (pNVar5->u).str.end = (OnigUChar *)0x0;
      }
      *top = pNVar5;
      if (pNVar5 == (Node *)0x0) {
LAB_00113ca9:
        iVar4 = -5;
        goto LAB_00113b41;
      }
      do {
        if ((iVar4 == term) || (iVar4 == 0xd)) goto LAB_00113b33;
        iVar4 = prs_exp(&local_50,tok,term,local_48,local_38,env,0);
        pNVar2 = local_50;
        if (iVar4 < 0) {
          onig_node_free(local_50);
          return iVar4;
        }
        if ((local_50->u).base.node_type == ND_LIST) {
          (pNVar5->u).cons.cdr = local_50;
          p_Var1 = local_50;
          do {
            pNVar6 = p_Var1;
            p_Var1 = (pNVar6->u).cons.cdr;
            local_50 = pNVar6;
          } while (p_Var1 != (_Node *)0x0);
        }
        else {
          pNVar6 = (Node *)malloc(0x48);
          if (pNVar6 == (_Node *)0x0) {
            pNVar6 = (_Node *)0x0;
          }
          else {
            (pNVar6->u).quant.next_head_exact = (_Node *)0x0;
            (pNVar6->u).cclass.mbuf = (BBuf *)0x0;
            (pNVar6->u).call.name = (OnigUChar *)0x0;
            (pNVar6->u).quant.head_exact = (_Node *)0x0;
            (pNVar6->u).base.body = (_Node *)0x0;
            (pNVar6->u).str.end = (OnigUChar *)0x0;
            *(undefined8 *)&pNVar6->u = 0;
            (pNVar6->u).base.parent = (_Node *)0x0;
            *(undefined8 *)((long)&pNVar6->u + 0x40) = 0;
          }
          if (pNVar6 == (_Node *)0x0) {
            pNVar6 = (_Node *)0x0;
          }
          else {
            (pNVar6->u).base.node_type = ND_LIST;
            (pNVar6->u).base.body = pNVar2;
            (pNVar6->u).str.end = (OnigUChar *)0x0;
          }
          (pNVar5->u).cons.cdr = pNVar6;
          if (pNVar6 == (_Node *)0x0) goto LAB_00113ca9;
        }
        pNVar5 = pNVar6;
      } while (iVar4 != 0);
      iVar4 = 0;
    }
LAB_00113b33:
    env->parse_depth = env->parse_depth - 1;
  }
  return iVar4;
}

Assistant:

static int
prs_branch(Node** top, PToken* tok, int term, UChar** src, UChar* end,
           ParseEnv* env, int group_head)
{
  int r;
  Node *node, **headp;

  *top = NULL;
  INC_PARSE_DEPTH(env->parse_depth);

  r = prs_exp(&node, tok, term, src, end, env, group_head);
  if (r < 0) {
    onig_node_free(node);
    return r;
  }

  if (r == TK_EOT || r == term || r == TK_ALT) {
    *top = node;
  }
  else {
    *top = node_new_list(node, NULL);
    if (IS_NULL(*top)) {
    mem_err:
      onig_node_free(node);
      return ONIGERR_MEMORY;
    }

    headp = &(ND_CDR(*top));
    while (r != TK_EOT && r != term && r != TK_ALT) {
      r = prs_exp(&node, tok, term, src, end, env, FALSE);
      if (r < 0) {
        onig_node_free(node);
        return r;
      }

      if (ND_TYPE(node) == ND_LIST) {
        *headp = node;
        while (IS_NOT_NULL(ND_CDR(node))) node = ND_CDR(node);
        headp = &(ND_CDR(node));
      }
      else {
        *headp = node_new_list(node, NULL);
        if (IS_NULL(*headp)) goto mem_err;
        headp = &(ND_CDR(*headp));
      }
    }
  }

  DEC_PARSE_DEPTH(env->parse_depth);
  return r;
}